

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int ParseEXRHeaderFromMemory
              (EXRAttribute *customAttributes,int *numCustomAttributes,int *width,int *height,
              uchar *memory)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  byte *pbVar4;
  int *piVar5;
  uint *puVar6;
  reference pvVar7;
  char *pcVar8;
  size_type sVar9;
  reference pvVar10;
  undefined8 *puVar11;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  long in_RDI;
  int *in_R8;
  int i;
  int dataHeight;
  int dataWidth;
  EXRAttribute attrib;
  char *marker_next;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string attrType;
  string attrName;
  vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> attribs;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  channels;
  float pixelAspectRatio;
  int numChannels;
  float screenWindowWidth;
  float screenWindowCenter [2];
  int displayWindow [4];
  int lineOrder;
  int dh;
  int dw;
  int dy;
  int dx;
  char header [4];
  char *marker;
  char *buf;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffdb0;
  value_type *in_stack_fffffffffffffdb8;
  string *in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  int local_14c;
  int local_120;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  string local_f0 [32];
  string local_d0 [32];
  vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> local_b0;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  local_98;
  uint local_7c;
  int local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68 [10];
  int *local_40;
  int *local_28;
  int *local_20;
  int *local_18;
  long local_10;
  int local_4;
  
  if (in_R8 == (int *)0x0) {
    local_4 = -1;
  }
  else {
    local_68[9] = 0x1312f76;
    if (*in_R8 == 0x1312f76) {
      if (((((char)in_R8[1] == '\x02') && (*(char *)((long)in_R8 + 5) == '\0')) &&
          (*(char *)((long)in_R8 + 6) == '\0')) && (*(char *)((long)in_R8 + 7) == '\0')) {
        local_40 = in_R8 + 2;
        local_68[8] = -1;
        local_68[7] = -1;
        local_68[6] = -1;
        local_68[5] = -1;
        local_68[4] = 0;
        local_68[0] = 0xffffffff;
        local_68[1] = 0xffffffff;
        local_68[2] = 0xffffffff;
        local_68[3] = 0xffffffff;
        local_28 = in_RCX;
        local_20 = in_RDX;
        local_18 = in_RSI;
        local_10 = in_RDI;
        memset(&local_70,0,8);
        local_74 = 0x3f800000;
        local_78 = -1;
        local_7c = 0x3f800000;
        std::
        vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
        ::vector((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                  *)0x1e1456);
        std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::vector
                  ((vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> *)0x1e1463);
        if (local_18 != (int *)0x0) {
          *local_18 = 0;
        }
        do {
          std::__cxx11::string::string(local_d0);
          std::__cxx11::string::string(local_f0);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1e14bd);
          piVar3 = (int *)anon_unknown.dwarf_7921d::ReadAttribute
                                    ((string *)
                                     CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
                                     in_stack_fffffffffffffdc0,
                                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
          if (piVar3 == (int *)0x0) {
            local_120 = 2;
            local_40 = (int *)((long)local_40 + 1);
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)local_d0);
            if (iVar2 == 0) {
              pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 (&local_108,0);
              if (4 < *pbVar4) {
                local_4 = -5;
                local_120 = 1;
                goto LAB_001e1c08;
              }
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)local_d0);
              if (iVar2 == 0) {
                anon_unknown.dwarf_7921d::ReadChannelInfo
                          ((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                            *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                           in_stack_fffffffffffffe08);
                sVar9 = std::
                        vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                        ::size(&local_98);
                local_78 = (int)sVar9;
                if (local_78 < 1) {
                  local_4 = -6;
                  local_120 = 1;
                  goto LAB_001e1c08;
                }
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)local_d0);
                if (iVar2 == 0) {
                  piVar5 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                            (in_stack_fffffffffffffdb0,
                                             CONCAT44(in_stack_fffffffffffffdac,
                                                      in_stack_fffffffffffffda8));
                  local_68[8] = *piVar5;
                  piVar5 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                            (in_stack_fffffffffffffdb0,
                                             CONCAT44(in_stack_fffffffffffffdac,
                                                      in_stack_fffffffffffffda8));
                  local_68[7] = *piVar5;
                  piVar5 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                            (in_stack_fffffffffffffdb0,
                                             CONCAT44(in_stack_fffffffffffffdac,
                                                      in_stack_fffffffffffffda8));
                  local_68[6] = *piVar5;
                  piVar5 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                            (in_stack_fffffffffffffdb0,
                                             CONCAT44(in_stack_fffffffffffffdac,
                                                      in_stack_fffffffffffffda8));
                  local_68[5] = *piVar5;
                  bVar1 = anon_unknown.dwarf_7921d::IsBigEndian();
                  if (bVar1) {
                    anon_unknown.dwarf_7921d::swap4(local_68 + 8);
                    anon_unknown.dwarf_7921d::swap4(local_68 + 7);
                    anon_unknown.dwarf_7921d::swap4(local_68 + 6);
                    anon_unknown.dwarf_7921d::swap4(local_68 + 5);
                  }
                }
                else {
                  iVar2 = std::__cxx11::string::compare((char *)local_d0);
                  if (iVar2 == 0) {
                    puVar6 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                               (in_stack_fffffffffffffdb0,
                                                CONCAT44(in_stack_fffffffffffffdac,
                                                         in_stack_fffffffffffffda8));
                    local_68[0] = *puVar6;
                    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                       (in_stack_fffffffffffffdb0,
                                        CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8
                                                ));
                    local_68[1] = *(undefined4 *)pvVar7;
                    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                       (in_stack_fffffffffffffdb0,
                                        CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8
                                                ));
                    local_68[2] = *(undefined4 *)pvVar7;
                    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                       (in_stack_fffffffffffffdb0,
                                        CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8
                                                ));
                    local_68[3] = *(undefined4 *)pvVar7;
                    bVar1 = anon_unknown.dwarf_7921d::IsBigEndian();
                    if (bVar1) {
                      anon_unknown.dwarf_7921d::swap4(local_68);
                      anon_unknown.dwarf_7921d::swap4(local_68 + 1);
                      anon_unknown.dwarf_7921d::swap4(local_68 + 2);
                      anon_unknown.dwarf_7921d::swap4(local_68 + 3);
                    }
                  }
                  else {
                    iVar2 = std::__cxx11::string::compare((char *)local_d0);
                    if (iVar2 == 0) {
                      pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                         (in_stack_fffffffffffffdb0,
                                          CONCAT44(in_stack_fffffffffffffdac,
                                                   in_stack_fffffffffffffda8));
                      local_68[4] = *(uint *)pvVar7;
                      in_stack_fffffffffffffe17 = anon_unknown.dwarf_7921d::IsBigEndian();
                      if ((bool)in_stack_fffffffffffffe17) {
                        anon_unknown.dwarf_7921d::swap4(local_68 + 4);
                      }
                    }
                    else {
                      iVar2 = std::__cxx11::string::compare((char *)local_d0);
                      if (iVar2 == 0) {
                        in_stack_fffffffffffffe08 =
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                       (in_stack_fffffffffffffdb0,
                                        CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8
                                                ));
                        local_7c = *(uint *)&(in_stack_fffffffffffffe08->
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             )._M_impl.super__Vector_impl_data._M_start;
                        bVar1 = anon_unknown.dwarf_7921d::IsBigEndian();
                        if (bVar1) {
                          anon_unknown.dwarf_7921d::swap4(&local_7c);
                        }
                      }
                      else {
                        iVar2 = std::__cxx11::string::compare((char *)local_d0);
                        if (iVar2 == 0) {
                          puVar6 = (uint *)std::
                                           vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                                     (in_stack_fffffffffffffdb0,
                                                      CONCAT44(in_stack_fffffffffffffdac,
                                                               in_stack_fffffffffffffda8));
                          local_70 = *puVar6;
                          puVar6 = (uint *)std::
                                           vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                                     (in_stack_fffffffffffffdb0,
                                                      CONCAT44(in_stack_fffffffffffffdac,
                                                               in_stack_fffffffffffffda8));
                          local_6c = *puVar6;
                          bVar1 = anon_unknown.dwarf_7921d::IsBigEndian();
                          if (bVar1) {
                            anon_unknown.dwarf_7921d::swap4(&local_70);
                            anon_unknown.dwarf_7921d::swap4(&local_6c);
                          }
                        }
                        else {
                          iVar2 = std::__cxx11::string::compare((char *)local_d0);
                          if (iVar2 == 0) {
                            puVar6 = (uint *)std::
                                             vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                             at(in_stack_fffffffffffffdb0,
                                                CONCAT44(in_stack_fffffffffffffdac,
                                                         in_stack_fffffffffffffda8));
                            local_74 = *puVar6;
                            in_stack_fffffffffffffdcf = anon_unknown.dwarf_7921d::IsBigEndian();
                            if ((bool)in_stack_fffffffffffffdcf) {
                              anon_unknown.dwarf_7921d::swap4(&local_74);
                            }
                          }
                          else if ((local_18 != (int *)0x0) && (*local_18 < 0x80)) {
                            printf("custom\n");
                            pcVar8 = (char *)std::__cxx11::string::c_str();
                            strdup(pcVar8);
                            pcVar8 = (char *)std::__cxx11::string::c_str();
                            strdup(pcVar8);
                            in_stack_fffffffffffffdb0 = &local_108;
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                      (in_stack_fffffffffffffdb0);
                            sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                              (in_stack_fffffffffffffdb0);
                            in_stack_fffffffffffffdb8 = (value_type *)malloc(sVar9);
                            in_stack_fffffffffffffdc0 =
                                 (string *)
                                 std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                           (in_stack_fffffffffffffdb0,
                                            CONCAT44(in_stack_fffffffffffffdac,
                                                     in_stack_fffffffffffffda8));
                            sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                              (&local_108);
                            memcpy(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdc0,sVar9);
                            std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::push_back
                                      ((vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> *)
                                       in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            local_120 = 0;
            local_40 = piVar3;
          }
LAB_001e1c08:
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffdc0);
          std::__cxx11::string::~string(local_f0);
          std::__cxx11::string::~string(local_d0);
          if (local_120 != 0) {
            if (local_120 == 2) {
              if ((int)local_68[8] < 0) {
                __assert_fail("dx >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/stanford-cs248[P]shading/CS248/include/CS248/tinyexr.h"
                              ,0x22d0,
                              "int ParseEXRHeaderFromMemory(EXRAttribute *, int *, int *, int *, const unsigned char *)"
                             );
              }
              if ((int)local_68[7] < 0) {
                __assert_fail("dy >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/stanford-cs248[P]shading/CS248/include/CS248/tinyexr.h"
                              ,0x22d1,
                              "int ParseEXRHeaderFromMemory(EXRAttribute *, int *, int *, int *, const unsigned char *)"
                             );
              }
              if ((int)local_68[6] < 0) {
                __assert_fail("dw >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/stanford-cs248[P]shading/CS248/include/CS248/tinyexr.h"
                              ,0x22d2,
                              "int ParseEXRHeaderFromMemory(EXRAttribute *, int *, int *, int *, const unsigned char *)"
                             );
              }
              if ((int)local_68[5] < 0) {
                __assert_fail("dh >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/stanford-cs248[P]shading/CS248/include/CS248/tinyexr.h"
                              ,0x22d3,
                              "int ParseEXRHeaderFromMemory(EXRAttribute *, int *, int *, int *, const unsigned char *)"
                             );
              }
              if (local_78 < 1) {
                __assert_fail("numChannels >= 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/stanford-cs248[P]shading/CS248/include/CS248/tinyexr.h"
                              ,0x22d4,
                              "int ParseEXRHeaderFromMemory(EXRAttribute *, int *, int *, int *, const unsigned char *)"
                             );
              }
              *local_20 = (local_68[6] - local_68[8]) + 1;
              *local_28 = (local_68[5] - local_68[7]) + 1;
              if (local_18 != (int *)0x0) {
                sVar9 = std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::size(&local_b0);
                if (0x7f < sVar9) {
                  __assert_fail("attribs.size() < TINYEXR_MAX_ATTRIBUTES",
                                "/workspace/llm4binary/github/license_c_cmakelists/stanford-cs248[P]shading/CS248/include/CS248/tinyexr.h"
                                ,0x22dd,
                                "int ParseEXRHeaderFromMemory(EXRAttribute *, int *, int *, int *, const unsigned char *)"
                               );
                }
                sVar9 = std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::size(&local_b0);
                *local_18 = (int)sVar9;
                local_14c = 0;
                while (iVar2 = local_14c,
                      sVar9 = std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::size
                                        (&local_b0), iVar2 < (int)sVar9) {
                  pvVar10 = std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::operator[]
                                      (&local_b0,(long)local_14c);
                  puVar11 = (undefined8 *)(local_10 + (long)local_14c * 0x20);
                  *puVar11 = pvVar10->name;
                  puVar11[1] = pvVar10->type;
                  puVar11[2] = *(undefined8 *)&pvVar10->size;
                  puVar11[3] = pvVar10->value;
                  local_14c = local_14c + 1;
                }
              }
              local_4 = 0;
            }
            std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::~vector
                      ((vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> *)
                       in_stack_fffffffffffffdc0);
            std::
            vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
            ::~vector((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                       *)in_stack_fffffffffffffdc0);
            return local_4;
          }
          in_stack_fffffffffffffdac = 0;
        } while( true );
      }
      local_4 = -4;
    }
    else {
      local_4 = -3;
    }
  }
  return local_4;
}

Assistant:

int ParseEXRHeaderFromMemory(EXRAttribute* customAttributes, int *numCustomAttributes, int *width, int *height,
                             const unsigned char *memory) {

  if (memory == NULL) {
    // Invalid argument
    return -1;
  }

  const char *buf = reinterpret_cast<const char *>(memory);

  const char *marker = &buf[0];

  // Header check.
  {
    const char header[] = {0x76, 0x2f, 0x31, 0x01};

    if (memcmp(marker, header, 4) != 0) {
      // if (err) {
      //  (*err) = "Header mismatch.";
      //}
      return -3;
    }
    marker += 4;
  }

  // Version, scanline.
  {
    // must be [2, 0, 0, 0]
    if (marker[0] != 2 || marker[1] != 0 || marker[2] != 0 || marker[3] != 0) {
      // if (err) {
      //  (*err) = "Unsupported version or scanline.";
      //}
      return -4;
    }

    marker += 4;
  }

  int dx = -1;
  int dy = -1;
  int dw = -1;
  int dh = -1;
  int lineOrder = 0; // @fixme
  int displayWindow[4] = {-1, -1, -1, -1}; // @fixme
  float screenWindowCenter[2] = {0.0f, 0.0f}; // @fixme
  float screenWindowWidth = 1.0f; // @fixme
  int numChannels = -1;
  float pixelAspectRatio = 1.0f; // @fixme
  std::vector<ChannelInfo> channels;
  std::vector<EXRAttribute> attribs;

  if (numCustomAttributes) {
    (*numCustomAttributes) = 0;
  }

  // Read attributes
  for (;;) {
    std::string attrName;
    std::string attrType;
    std::vector<unsigned char> data;
    const char *marker_next = ReadAttribute(attrName, attrType, data, marker);
    if (marker_next == NULL) {
      marker++; // skip '\0'
      break;
    }

    if (attrName.compare("compression") == 0) {
      // must be 0:No compression, 1: RLE or 3: ZIP
      //      if (data[0] != 0 && data[0] != 1 && data[0] != 3) {

      //	mwkm
      //	0 : NO_COMPRESSION
      //	1 : RLE
      //	2 : ZIPS (Single scanline)
      //	3 : ZIP (16-line block)
      //	4 : PIZ (32-line block)
      if (data[0] > 4) {
        // if (err) {
        //  (*err) = "Unsupported compression type.";
        //}
        return -5;
      }

    } else if (attrName.compare("channels") == 0) {

      // name: zero-terminated string, from 1 to 255 bytes long
      // pixel type: int, possible values are: UINT = 0 HALF = 1 FLOAT = 2
      // pLinear: unsigned char, possible values are 0 and 1
      // reserved: three chars, should be zero
      // xSampling: int
      // ySampling: int

      ReadChannelInfo(channels, data);

      numChannels = channels.size();

      if (numChannels < 1) {
        // if (err) {
        //  (*err) = "Invalid channels format.";
        //}
        return -6;
      }

    } else if (attrName.compare("dataWindow") == 0) {
      memcpy(&dx, &data.at(0), sizeof(int));
      memcpy(&dy, &data.at(4), sizeof(int));
      memcpy(&dw, &data.at(8), sizeof(int));
      memcpy(&dh, &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&dx));
        swap4(reinterpret_cast<unsigned int *>(&dy));
        swap4(reinterpret_cast<unsigned int *>(&dw));
        swap4(reinterpret_cast<unsigned int *>(&dh));
      }
    } else if (attrName.compare("displayWindow") == 0) {
      memcpy(&displayWindow[0], &data.at(0), sizeof(int));
      memcpy(&displayWindow[1], &data.at(4), sizeof(int));
      memcpy(&displayWindow[2], &data.at(8), sizeof(int));
      memcpy(&displayWindow[3], &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[0]));
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[1]));
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[2]));
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[3]));
      }
    } else if (attrName.compare("lineOrder") == 0) {
      memcpy(&lineOrder, &data.at(0), sizeof(float));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&lineOrder));
      }
    } else if (attrName.compare("pixelAspectRatio") == 0) {
      memcpy(&pixelAspectRatio, &data.at(0), sizeof(float));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&pixelAspectRatio));
      }
    } else if (attrName.compare("screenWindowCenter") == 0) {
      memcpy(&screenWindowCenter[0], &data.at(0), sizeof(float));
      memcpy(&screenWindowCenter[1], &data.at(4), sizeof(float));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&screenWindowCenter[0]));
        swap4(reinterpret_cast<unsigned int *>(&screenWindowCenter[1]));
      }
    } else if (attrName.compare("screenWindowWidth") == 0) {
      memcpy(&screenWindowWidth, &data.at(0), sizeof(float));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&screenWindowWidth));
      }
      
    } else {
      // Custom attribute(up to TINYEXR_MAX_ATTRIBUTES)
      if (numCustomAttributes && ((*numCustomAttributes) < TINYEXR_MAX_ATTRIBUTES)) {
        printf("custom\n");
        EXRAttribute attrib;
        attrib.name = strdup(attrName.c_str());
        attrib.type = strdup(attrType.c_str());
        attrib.size = data.size();
        attrib.value = (unsigned char*)malloc(data.size());
        memcpy((char*)attrib.value, &data.at(0), data.size());
        attribs.push_back(attrib);
      }
    }

    marker = marker_next;
  }

  assert(dx >= 0);
  assert(dy >= 0);
  assert(dw >= 0);
  assert(dh >= 0);
  assert(numChannels >= 1);

  int dataWidth = dw - dx + 1;
  int dataHeight = dh - dy + 1;

  (*width) = dataWidth;
  (*height) = dataHeight;

  if (numCustomAttributes) {
    assert(attribs.size() < TINYEXR_MAX_ATTRIBUTES);
    (*numCustomAttributes) = attribs.size();

    // Assume the pointer to customAttributes has enough memory to store.
    for (int i = 0; i < (int)attribs.size(); i++) {
      customAttributes[i] = attribs[i];
    }
  } 

  return 0;
}